

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O2

void __thiscall
fmt::v5::vprint<char[10],char>
          (v5 *this,FILE *f,text_style *ts,char (*format) [10],
          basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          args)

{
  FILE em;
  FILE FVar1;
  size_t sVar2;
  format_args args_00;
  format_args args_01;
  string_view format_str;
  string_view format_str_00;
  ansi_color_escape<char> local_44;
  
  args_00.
  super_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  .field_1 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_2
              )args.types_;
  em = f[0x12];
  if (em != (FILE)0x0) {
    internal::ansi_color_escape<char>::ansi_color_escape(&local_44,(emphasis)em);
    fputs(local_44.buffer,(FILE *)this);
  }
  FVar1 = f[0x10];
  if (FVar1 == (FILE)0x1) {
    internal::make_foreground_color<char>(&local_44,*(color_type *)f);
    fputs(local_44.buffer,(FILE *)this);
  }
  if (f[0x11] == (FILE)0x1) {
    internal::make_background_color<char>(&local_44,*(color_type *)(f + 8));
    fputs(local_44.buffer,(FILE *)this);
    sVar2 = strlen((char *)ts);
    args_00.
    super_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
    .types_ = (unsigned_long_long)format;
    format_str.size_ = sVar2;
    format_str.data_ = (char *)ts;
    vprint((FILE *)this,format_str,args_00);
  }
  else {
    sVar2 = strlen((char *)ts);
    args_01.
    super_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
    .field_1.values_ =
         args_00.
         super_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
         .field_1.values_;
    args_01.
    super_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
    .types_ = (unsigned_long_long)format;
    format_str_00.size_ = sVar2;
    format_str_00.data_ = (char *)ts;
    vprint((FILE *)this,format_str_00,args_01);
    if (FVar1 != (FILE)0x1 && em == (FILE)0x0) {
      return;
    }
  }
  internal::reset_color<char>((FILE *)this);
  return;
}

Assistant:

void vprint(std::FILE *f, const text_style &ts, const S &format,
            basic_format_args<typename buffer_context<Char>::type> args) {
  bool has_style = false;
  if (ts.has_emphasis()) {
    has_style = true;
    internal::fputs<Char>(
          internal::make_emphasis<Char>(ts.get_emphasis()), f);
  }
  if (ts.has_foreground()) {
    has_style = true;
    internal::fputs<Char>(
          internal::make_foreground_color<Char>(ts.get_foreground()), f);
  }
  if (ts.has_background()) {
    has_style = true;
    internal::fputs<Char>(
        internal::make_background_color<Char>(ts.get_background()), f);
  }
  vprint(f, format, args);
  if (has_style) {
    internal::reset_color<Char>(f);
  }
}